

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O0

void rcnb_encode_byte(uchar value_in,wchar_t **value_out)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t **value_out_local;
  uchar value_in_local;
  
  if (value_in < 0x80) {
    wVar1 = L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[(int)(value_in / 0xf)];
    pwVar2 = *value_out;
    *value_out = pwVar2 + 1;
    *pwVar2 = wVar1;
    wVar1 = L"cCĆćĈĉĊċČčƇƈÇȻȼ"[(int)((uint)value_in % 0xf)];
    pwVar2 = *value_out;
    *value_out = pwVar2 + 1;
    *pwVar2 = wVar1;
  }
  else {
    wVar1 = L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[(int)((value_in & 0x7f) / 10)];
    pwVar2 = *value_out;
    *value_out = pwVar2 + 1;
    *pwVar2 = wVar1;
    wVar1 = L"bBƀƁƃƄƅßÞþ"[(int)((uint)(value_in & 0x7f) % 10)];
    pwVar2 = *value_out;
    *value_out = pwVar2 + 1;
    *pwVar2 = wVar1;
  }
  return;
}

Assistant:

void rcnb_encode_byte(unsigned char value_in, wchar_t** value_out)
{
    if (value_in > 0x7F) {
        value_in = (unsigned char)(value_in & 0x7F);
        *(*value_out)++ = cn[value_in / sb];
        *(*value_out)++ = cb[value_in % sb];
        return;
    }
    *(*value_out)++ = cr[value_in / sc];
    *(*value_out)++ = cc[value_in % sc];
}